

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

ostream * operator<<(ostream *o,span<int> *d)

{
  iterator piVar1;
  ostream *this;
  iterator end;
  iterator begin;
  span<int> *d_local;
  ostream *o_local;
  
  end = mpt::span<int>::begin(d);
  piVar1 = mpt::span<int>::end(d);
  if (end != piVar1) {
    std::ostream::operator<<(o,*end);
    while (end = end + 1, end != piVar1) {
      this = std::operator<<(o,' ');
      std::ostream::operator<<(this,*end);
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}